

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void decode_rcpw_insert(DisasContext_conflict14 *ctx)

{
  TCGContext_conflict9 *tcg_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t val;
  uint32_t len;
  uint32_t ofs;
  TCGv_i32 arg2;
  TCGv_i32 temp;
  int32_t const4;
  int32_t width;
  int32_t pos;
  int r2;
  int r1;
  uint32_t op2;
  TCGContext_conflict9 *tcg_ctx;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = extract32(ctx->opcode,0x15,2);
  uVar2 = extract32(ctx->opcode,8,4);
  uVar3 = extract32(ctx->opcode,0x1c,4);
  val = extract32(ctx->opcode,0xc,4);
  len = extract32(ctx->opcode,0x10,5);
  ofs = extract32(ctx->opcode,0x17,5);
  if (uVar1 == 0) {
    if ((int)(ofs + len) < 0x21) {
      arg2 = tcg_const_i32_tricore(tcg_ctx_00,val);
      tcg_gen_deposit_i32_tricore
                (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar3],tcg_ctx_00->cpu_gpr_d[(int)uVar2],arg2
                 ,ofs,len);
      tcg_temp_free_i32(tcg_ctx_00,arg2);
    }
  }
  else if (uVar1 == 1) {
    if ((uVar3 & 1) != 0) {
      generate_trap(ctx,2,3);
    }
    if ((int)(ofs + len) < 0x21) {
      tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)(uVar3 + 1)],
                       (1 << ((byte)len & 0x1f)) + -1 << ((byte)ofs & 0x1f));
      tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar3],val << ((byte)ofs & 0x1f));
    }
  }
  else {
    generate_trap(ctx,2,1);
  }
  return;
}

Assistant:

static void decode_rcpw_insert(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    uint32_t op2;
    int r1, r2;
    int32_t pos, width, const4;

    TCGv temp;

    op2    = MASK_OP_RCPW_OP2(ctx->opcode);
    r1     = MASK_OP_RCPW_S1(ctx->opcode);
    r2     = MASK_OP_RCPW_D(ctx->opcode);
    const4 = MASK_OP_RCPW_CONST4(ctx->opcode);
    width  = MASK_OP_RCPW_WIDTH(ctx->opcode);
    pos    = MASK_OP_RCPW_POS(ctx->opcode);

    switch (op2) {
    case OPC2_32_RCPW_IMASK:
        CHECK_REG_PAIR(r2);
        /* if pos + width > 32 undefined result */
        if (pos + width <= 32) {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r2+1], ((1u << width) - 1) << pos);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r2], (const4 << pos));
        }
        break;
    case OPC2_32_RCPW_INSERT:
        /* if pos + width > 32 undefined result */
        if (pos + width <= 32) {
            temp = tcg_const_i32(tcg_ctx, const4);
            tcg_gen_deposit_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r2], tcg_ctx->cpu_gpr_d[r1], temp, pos, width);
            tcg_temp_free(tcg_ctx, temp);
        }
        break;
    default:
        generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
    }
}